

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

void Saig_ManWindowInsertSmall_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjSmall,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  int iVar1;
  ulong uVar2;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar3;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar4;
  
  if ((pObjSmall->field_5).pData == (void *)0x0) {
    iVar1 = pObjSmall->Id;
    if (((long)iVar1 < 0) || (vSmallPi2BigNode->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar4 = (Aig_Obj_t *)vSmallPi2BigNode->pArray[iVar1];
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      if ((*(uint *)&pObjSmall->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObjSmall)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x14d,
                      "void Saig_ManWindowInsertSmall_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjSmall->pFanin0 & 0xfffffffffffffffe),vBigNode2SmallPo
                 ,vSmallPi2BigNode);
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjSmall->pFanin1 & 0xfffffffffffffffe),vBigNode2SmallPo
                 ,vSmallPi2BigNode);
      if (((ulong)pObjSmall & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar2 = (ulong)pObjSmall->pFanin0 & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)pObjSmall->pFanin0 & 1) ^ *(ulong *)(uVar2 + 0x28));
      }
      uVar2 = (ulong)pObjSmall->pFanin1 & 0xfffffffffffffffe;
      if (uVar2 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObjSmall->pFanin1 & 1) ^ *(ulong *)(uVar2 + 0x28));
      }
      aVar3.pData = Aig_And(pNew,pAVar4,p1);
    }
    else {
      Saig_ManWindowInsertBig_rec(pNew,pAVar4,vBigNode2SmallPo,vSmallPi2BigNode);
      aVar3 = pAVar4->field_5;
    }
    pObjSmall->field_5 = aVar3;
  }
  return;
}

Assistant:

void Saig_ManWindowInsertSmall_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjSmall, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjSmall->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vSmallPi2BigNode, pObjSmall->Id )) )
    {
        Saig_ManWindowInsertBig_rec( pNew, pMatch, vBigNode2SmallPo, vSmallPi2BigNode );
        pObjSmall->pData = pMatch->pData;
        return;        
    }
    assert( Aig_ObjIsNode(pObjSmall) );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin1(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjSmall->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjSmall), Aig_ObjChild1Copy(pObjSmall) );
}